

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

void am_invoke_cancel_proc(Am_Object *cmd)

{
  Am_Object invoke_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_10,10);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Am_Object(&local_20,&local_18);
  done_with_invoke_window(&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_invoke_cancel, (Am_Object cmd))
{
  Am_Object invoke_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  done_with_invoke_window(invoke_window);
}